

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

bool __thiscall
ctemplate::SectionTemplateNode::AddVariableNode
          (SectionTemplateNode *this,TemplateToken *token,Template *my_template)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TemplateContext TVar3;
  HtmlParser *htmlparser;
  pointer ppMVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  VariableTemplateNode *this_00;
  _List_node_base *p_Var10;
  char *pcVar11;
  char *pcVar12;
  _Alloc_hider _Var13;
  bool bVar14;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  modvals;
  string error_msg;
  string variable_name;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  local_a8;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  local_88;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (token == (TemplateToken *)0x0) {
    __assert_fail("token",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                  ,0x62e,
                  "bool ctemplate::SectionTemplateNode::AddVariableNode(TemplateToken *, Template *)"
                 );
  }
  TVar3 = my_template->initial_context_;
  bVar14 = true;
  if (TVar3 == TC_MANUAL) goto LAB_0011aabf;
  htmlparser = my_template->htmlparser_;
  local_50[0] = &local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,token->text,token->text + token->textlen);
  iVar6 = std::__cxx11::string::compare((char *)local_50);
  if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_50), iVar6 == 0)) {
    bVar14 = true;
    if (TVar3 - TC_HTML < 3) {
      if (htmlparser == (HtmlParser *)0x0) {
        __assert_fail("htmlparser",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                      ,0x63e,
                      "bool ctemplate::SectionTemplateNode::AddVariableNode(TemplateToken *, Template *)"
                     );
      }
      iVar6 = ctemplate_htmlparser::htmlparser_state(htmlparser->parser_);
      if (iVar6 == 7) {
        bVar14 = false;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)local_50);
        pcVar12 = "\n";
        if (iVar7 == 0) {
          pcVar12 = " ";
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar11 = "";
        if (iVar7 == 0) {
          pcVar11 = "";
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar12,pcVar11);
        iVar7 = ctemplate_htmlparser::htmlparser_parse
                          (htmlparser->parser_,local_70._M_dataplus._M_p,
                           (int)local_70._M_string_length);
        bVar14 = iVar7 != 7;
      }
      if ((iVar6 != 7) &&
         (_Var13._M_p = local_70._M_dataplus._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_70._M_dataplus._M_p != &local_70.field_2)) goto LAB_0011aaa6;
    }
  }
  else {
    local_70._M_dataplus._M_p = (pointer)local_50[0];
    bVar5 = std::binary_search<char_const*const*,char_const*,ctemplate::StringHash>
                      (&Template::kSafeWhitelistedVariables,&vtable);
    bVar14 = true;
    if (!bVar5) {
      local_88.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar2 = &local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)paVar2;
      if (TVar3 == TC_CSS) {
        if (htmlparser == (HtmlParser *)0x0) {
          __assert_fail("htmlparser",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x216,
                        "const vector<const ModifierAndValue *> ctemplate::(anonymous namespace)::GetModifierForContext(TemplateContext, HtmlParser *, const Template *)"
                       );
        }
        GetModifierForCss(&local_a8,htmlparser,&local_70);
      }
      else if (TVar3 == TC_JSON) {
        GetModifierForJson(&local_a8,htmlparser,&local_70);
      }
      else if (TVar3 == TC_XML) {
        GetModifierForXml(&local_a8,htmlparser,&local_70);
      }
      else {
        if (2 < TVar3 - TC_HTML) {
          __assert_fail("AUTO_ESCAPE_PARSING_CONTEXT(my_context)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x21b,
                        "const vector<const ModifierAndValue *> ctemplate::(anonymous namespace)::GetModifierForContext(TemplateContext, HtmlParser *, const Template *)"
                       );
        }
        if (htmlparser == (HtmlParser *)0x0) {
          __assert_fail("htmlparser",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x21c,
                        "const vector<const ModifierAndValue *> ctemplate::(anonymous namespace)::GetModifierForContext(TemplateContext, HtmlParser *, const Template *)"
                       );
        }
        GetModifierForHtmlJs(&local_a8,htmlparser,&local_70);
      }
      ppMVar4 = local_88.
                super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_88.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_a8.
           super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_88.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_a8.
           super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_a8.
           super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (ppMVar4 != (pointer)0x0) {
        operator_delete(ppMVar4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.
             super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88.
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_88.
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Template ",9);
        pcVar12 = (my_template->resolved_filename_)._M_dataplus._M_p;
        if (pcVar12 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x150388);
        }
        else {
          sVar8 = strlen(pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Auto-Escape: ",0xd);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_70._M_dataplus._M_p,
                            local_70._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      bVar14 = local_88.
               super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_88.
               super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar14) {
        TemplateToken::UpdateModifier(token,&local_88);
      }
      _Var13._M_p = (pointer)local_88.
                             super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.
             super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
LAB_0011aaa6:
        operator_delete(_Var13._M_p);
      }
    }
  }
  if (local_50[0] != &local_40) {
    operator_delete(local_50[0]);
  }
LAB_0011aabf:
  this_00 = (VariableTemplateNode *)operator_new(0x58);
  VariableTemplateNode::VariableTemplateNode(this_00,token);
  p_Var10 = (_List_node_base *)operator_new(0x18);
  p_Var10[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  psVar1 = &(this->node_list_).
            super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return bVar14;
}

Assistant:

bool SectionTemplateNode::AddVariableNode(TemplateToken* token,
                                          Template* my_template) {
  assert(token);
  bool success = true;
  HtmlParser *htmlparser = my_template->htmlparser_;
  TemplateContext initial_context = my_template->initial_context_;

  if (AUTO_ESCAPE_MODE(initial_context)) {
    // Determines modifiers for the variable in auto escape mode.
    string variable_name(token->text, token->textlen);
    // We declare in the documentation that if the user changes the
    // value of these variables, they must only change it to a value
    // that's "equivalent" from the point of view of an html parser.
    // So it's ok to hard-code in that these are " " and "\n",
    // respectively, even though in theory the user could change them
    // (to say, BI_NEWLINE == "\r\n").
    if (variable_name == "BI_SPACE" || variable_name == "BI_NEWLINE") {
      if (AUTO_ESCAPE_PARSING_CONTEXT(initial_context)) {
        assert(htmlparser);
        if (htmlparser->state() == HtmlParser::STATE_ERROR ||
            htmlparser->Parse(variable_name == "BI_SPACE" ? " " : "\n") ==
            HtmlParser::STATE_ERROR)
          success = false;
      }
    } else if (binary_search(Template::kSafeWhitelistedVariables,
                             Template::kSafeWhitelistedVariables +
                             arraysize(Template::kSafeWhitelistedVariables),
                             variable_name.c_str(),
                             // Luckily, StringHash(a, b) is defined as "a < b"
                             StringHash())) {
      // Do not escape the variable, it is whitelisted.
    } else {
      vector<const ModifierAndValue*> modvals =
          GetModifierForContext(initial_context, htmlparser, my_template);
      // There should always be at least one modifier in any Auto-Escape mode.
      if (modvals.empty())
        success = false;
      else
        token->UpdateModifier(modvals);
    }
  }
  node_list_.push_back(new VariableTemplateNode(*token));
  return success;
}